

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fsgldiv_m68k(CPUM68KState_conflict *env,FPReg_conflict *res,FPReg_conflict *val0,
                        FPReg_conflict *val1)

{
  float_status *status;
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  floatx80 fVar4;
  floatx80 fVar5;
  floatx80 a;
  floatx80 b;
  
  status = &env->fp_status;
  cVar1 = (env->fp_status).float_rounding_mode;
  cVar2 = (env->fp_status).floatx80_rounding_precision;
  (env->fp_status).floatx80_rounding_precision = ' ';
  (env->fp_status).float_rounding_mode = '\x03';
  fVar4._12_4_ = 0;
  fVar4._0_12_ = *(undefined1 (*) [12])val1;
  fVar4 = floatx80_round_m68k(fVar4,status);
  fVar5._12_4_ = 0;
  fVar5._0_12_ = *(undefined1 (*) [12])val0;
  fVar5 = floatx80_round_m68k(fVar5,status);
  b._8_8_ = fVar5._8_8_ & 0xffffffff;
  (env->fp_status).float_rounding_mode = cVar1;
  auVar3 = fVar4._0_12_;
  a._12_4_ = 0;
  a.low = auVar3._0_8_;
  a.high = auVar3._8_2_;
  a._10_2_ = auVar3._10_2_;
  b.low = fVar5.low;
  fVar4 = floatx80_div_m68k(a,b,status);
  (res->d).low = fVar4.low;
  (res->d).high = fVar4.high;
  (env->fp_status).floatx80_rounding_precision = cVar2;
  return;
}

Assistant:

void HELPER(fsgldiv)(CPUM68KState *env, FPReg *res, FPReg *val0, FPReg *val1)
{
    int rounding_mode = get_float_rounding_mode(&env->fp_status);
    floatx80 a, b;

    PREC_BEGIN(32);
    set_float_rounding_mode(float_round_to_zero, &env->fp_status);
    a = floatx80_round(val1->d, &env->fp_status);
    b = floatx80_round(val0->d, &env->fp_status);
    set_float_rounding_mode(rounding_mode, &env->fp_status);
    res->d = floatx80_div(a, b, &env->fp_status);
    PREC_END();
}